

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigConstr2.c
# Opt level: O3

int Ssw_ManProfileConstraints(Aig_Man_t *p,int nWords,int nFrames,int fVerbose)

{
  uint *puVar1;
  int iVar2;
  Vec_Ptr_t *pVVar3;
  long lVar4;
  long lVar5;
  void **ppvVar6;
  long lVar7;
  long lVar8;
  int iVar9;
  undefined8 *__ptr;
  void *pvVar10;
  void *pvVar11;
  ulong uVar12;
  uint uVar13;
  int iVar14;
  ulong uVar15;
  long lVar16;
  undefined8 *puVar17;
  ulong uVar18;
  int i;
  long lVar19;
  ulong uVar20;
  long lVar21;
  uint uVar22;
  uint uVar23;
  int iVar24;
  float fVar25;
  timespec ts;
  int *local_80;
  long local_70;
  int *local_68;
  timespec local_50;
  Aig_Man_t *local_40;
  void **local_38;
  
  iVar9 = clock_gettime(3,&local_50);
  if (iVar9 < 0) {
    local_70 = 1;
  }
  else {
    lVar16 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_50.tv_nsec),8);
    local_70 = ((lVar16 >> 7) - (lVar16 >> 0x3f)) + local_50.tv_sec * -1000000;
  }
  if (fVerbose != 0) {
    printf("Simulating %d nodes and %d flops for %d frames with %d words... ",
           (ulong)(uint)(p->nObjs[6] + p->nObjs[5]),(ulong)(uint)p->nRegs,(ulong)(uint)nFrames,
           nWords);
  }
  Aig_ManRandom(1);
  lVar16 = (long)p->vObjs->nSize;
  uVar12 = lVar16 + 2;
  __ptr = (undefined8 *)malloc(((long)nWords * 4 + 8) * uVar12);
  if (-2 < lVar16) {
    pvVar10 = __ptr + lVar16 + 2;
    uVar15 = uVar12 & 0xffffffff;
    puVar17 = __ptr;
    do {
      *puVar17 = pvVar10;
      puVar17 = puVar17 + 1;
      pvVar10 = (void *)((long)pvVar10 + (long)nWords * 4);
      uVar15 = uVar15 - 1;
    } while (uVar15 != 0);
    uVar15 = 0;
    do {
      memset((void *)__ptr[uVar15],0,(long)(nWords * 4));
      uVar15 = uVar15 + 1;
    } while (uVar12 != uVar15);
  }
  iVar9 = p->nTruePos;
  lVar16 = (long)iVar9;
  iVar24 = 0x10;
  if (0xe < iVar9 - 1U) {
    iVar24 = iVar9;
  }
  if (iVar24 == 0) {
    local_80 = (int *)malloc(0x10);
    *local_80 = 0;
    local_80[2] = 0;
    local_80[3] = 0;
    local_80[1] = iVar9;
    pvVar10 = (void *)0x0;
  }
  else {
    pvVar10 = malloc((long)iVar24 << 2);
    if (pvVar10 != (void *)0x0) {
      memset(pvVar10,0,lVar16 * 4);
    }
    local_80 = (int *)malloc(0x10);
    *local_80 = iVar24;
    pvVar11 = malloc((long)iVar24 << 2);
    *(void **)(local_80 + 2) = pvVar11;
    local_80[1] = iVar9;
    if (pvVar11 != (void *)0x0) {
      memset(pvVar11,0,lVar16 * 4);
    }
  }
  local_68 = local_80 + 1;
  iVar9 = p->pConst1->Id;
  if ((-1 < (long)iVar9) && (uVar23 = (uint)uVar12, iVar9 < (int)uVar23)) {
    uVar12 = (ulong)(uint)nWords;
    if (0 < nWords) {
      memset((void *)__ptr[iVar9],0xff,uVar12 * 4);
    }
    iVar9 = p->nRegs;
    if (0 < iVar9) {
      pVVar3 = p->vCos;
      iVar24 = 0;
      do {
        uVar13 = p->nTruePos + iVar24;
        if (((int)uVar13 < 0) || (pVVar3->nSize <= (int)uVar13)) goto LAB_006e254e;
        iVar14 = *(int *)((long)pVVar3->pArray[uVar13] + 0x24);
        if (((long)iVar14 < 0) || ((int)uVar23 <= iVar14)) goto LAB_006e254e;
        if (0 < nWords) {
          memset((void *)__ptr[iVar14],0,uVar12 * 4);
          iVar9 = p->nRegs;
        }
        iVar24 = iVar24 + 1;
      } while (iVar24 < iVar9);
    }
    iVar9 = p->vObjs->nSize;
    if (((-1 < (long)iVar9) && (iVar9 < (int)uVar23)) && (iVar9 + 1U < uVar23)) {
      if (0 < nFrames) {
        lVar21 = __ptr[iVar9];
        lVar4 = __ptr[iVar9 + 1U];
        iVar9 = 0;
        local_40 = p;
        do {
          iVar24 = p->nTruePis;
          if (0 < iVar24) {
            lVar19 = 0;
            do {
              if (p->vCis->nSize <= lVar19) goto LAB_006e254e;
              iVar14 = *(int *)((long)p->vCis->pArray[lVar19] + 0x24);
              if (((long)iVar14 < 0) || ((int)uVar23 <= iVar14)) goto LAB_006e254e;
              if (0 < nWords) {
                lVar5 = __ptr[iVar14];
                uVar15 = 0;
                do {
                  uVar13 = Aig_ManRandom(0);
                  *(uint *)(lVar5 + uVar15 * 4) = uVar13;
                  uVar15 = uVar15 + 1;
                } while (uVar12 != uVar15);
                iVar24 = local_40->nTruePis;
                p = local_40;
              }
              lVar19 = lVar19 + 1;
            } while (lVar19 < iVar24);
          }
          iVar24 = p->nRegs;
          if (0 < iVar24) {
            pVVar3 = p->vCos;
            iVar14 = 0;
            do {
              uVar13 = p->nTruePos + iVar14;
              if ((((int)uVar13 < 0) || (pVVar3->nSize <= (int)uVar13)) ||
                 ((uVar22 = p->nTruePis + iVar14, (int)uVar22 < 0 || (p->vCis->nSize <= (int)uVar22)
                  ))) goto LAB_006e254e;
              iVar2 = *(int *)((long)p->vCis->pArray[uVar22] + 0x24);
              if (((long)iVar2 < 0) || ((int)uVar23 <= iVar2)) goto LAB_006e254e;
              uVar13 = *(uint *)((long)pVVar3->pArray[uVar13] + 0x24);
              if (((long)(int)uVar13 < 0) || (uVar23 <= uVar13)) goto LAB_006e254e;
              if (0 < nWords) {
                lVar19 = __ptr[iVar2];
                lVar5 = __ptr[(int)uVar13];
                uVar15 = 0;
                do {
                  *(undefined4 *)(lVar19 + uVar15 * 4) = *(undefined4 *)(lVar5 + uVar15 * 4);
                  uVar15 = uVar15 + 1;
                } while (uVar12 != uVar15);
                iVar24 = p->nRegs;
              }
              iVar14 = iVar14 + 1;
            } while (iVar14 < iVar24);
          }
          pVVar3 = p->vObjs;
          if (0 < pVVar3->nSize) {
            ppvVar6 = pVVar3->pArray;
            lVar19 = 0;
            do {
              pvVar11 = ppvVar6[lVar19];
              if ((pvVar11 != (void *)0x0) &&
                 (0xfffffffd < (*(uint *)((long)pvVar11 + 0x18) & 7) - 7)) {
                iVar24 = *(int *)((long)pvVar11 + 0x24);
                if (((long)iVar24 < 0) ||
                   (((int)uVar23 <= iVar24 || (uVar15 = *(ulong *)((long)pvVar11 + 8), uVar15 == 0))
                   )) goto LAB_006e254e;
                uVar13 = *(uint *)((uVar15 & 0xfffffffffffffffe) + 0x24);
                if (((long)(int)uVar13 < 0) ||
                   ((uVar23 <= uVar13 || (uVar20 = *(ulong *)((long)pvVar11 + 0x10), uVar20 == 0))))
                goto LAB_006e254e;
                uVar22 = *(uint *)((uVar20 & 0xfffffffffffffffe) + 0x24);
                if (((long)(int)uVar22 < 0) || (uVar23 <= uVar22)) goto LAB_006e254e;
                lVar5 = __ptr[iVar24];
                lVar8 = __ptr[(int)uVar13];
                lVar7 = __ptr[(int)uVar22];
                if ((uVar15 & 1) == 0) {
                  if ((uVar20 & 1) == 0) {
                    if (0 < nWords) {
                      uVar15 = 0;
                      do {
                        *(uint *)(lVar5 + uVar15 * 4) =
                             *(uint *)(lVar7 + uVar15 * 4) & *(uint *)(lVar8 + uVar15 * 4);
                        uVar15 = uVar15 + 1;
                      } while (uVar12 != uVar15);
                    }
                  }
                  else if (0 < nWords) {
                    uVar15 = 0;
                    do {
                      *(uint *)(lVar5 + uVar15 * 4) =
                           ~*(uint *)(lVar7 + uVar15 * 4) & *(uint *)(lVar8 + uVar15 * 4);
                      uVar15 = uVar15 + 1;
                    } while (uVar12 != uVar15);
                  }
                }
                else if ((uVar20 & 1) == 0) {
                  if (0 < nWords) {
                    uVar15 = 0;
                    do {
                      *(uint *)(lVar5 + uVar15 * 4) =
                           ~*(uint *)(lVar8 + uVar15 * 4) & *(uint *)(lVar7 + uVar15 * 4);
                      uVar15 = uVar15 + 1;
                    } while (uVar12 != uVar15);
                  }
                }
                else if (0 < nWords) {
                  uVar15 = 0;
                  do {
                    *(uint *)(lVar5 + uVar15 * 4) =
                         ~(*(uint *)(lVar7 + uVar15 * 4) | *(uint *)(lVar8 + uVar15 * 4));
                    uVar15 = uVar15 + 1;
                  } while (uVar12 != uVar15);
                }
              }
              lVar19 = lVar19 + 1;
            } while (lVar19 < pVVar3->nSize);
          }
          if (0 < nWords) {
            uVar15 = 0;
            do {
              *(undefined4 *)(lVar4 + uVar15 * 4) = 0;
              *(undefined4 *)(lVar21 + uVar15 * 4) = 0;
              uVar15 = uVar15 + 1;
            } while (uVar12 != uVar15);
          }
          pVVar3 = p->vCos;
          if (0 < pVVar3->nSize) {
            local_38 = pVVar3->pArray;
            lVar19 = 0;
            do {
              iVar24 = *(int *)((long)local_38[lVar19] + 0x24);
              if ((((long)iVar24 < 0) || ((int)uVar23 <= iVar24)) ||
                 (uVar15 = *(ulong *)((long)local_38[lVar19] + 8), uVar15 == 0)) goto LAB_006e254e;
              uVar13 = *(uint *)((uVar15 & 0xfffffffffffffffe) + 0x24);
              if (((long)(int)uVar13 < 0) || (uVar23 <= uVar13)) goto LAB_006e254e;
              lVar5 = __ptr[iVar24];
              lVar8 = __ptr[(int)uVar13];
              if ((lVar19 < p->nTruePos) && ((long)p->nTruePos - (long)p->nConstrs <= lVar19)) {
                if ((uVar15 & 1) == 0) {
                  if (0 < nWords) {
                    uVar15 = 0;
                    do {
                      puVar1 = (uint *)(lVar5 + uVar15 * 4);
                      *puVar1 = *puVar1 | *(uint *)(lVar8 + uVar15 * 4);
                      uVar15 = uVar15 + 1;
                    } while (uVar12 != uVar15);
                  }
                }
                else if (0 < nWords) {
                  uVar15 = 0;
                  do {
                    puVar1 = (uint *)(lVar5 + uVar15 * 4);
                    *puVar1 = *puVar1 | ~*(uint *)(lVar8 + uVar15 * 4);
                    uVar15 = uVar15 + 1;
                  } while (uVar12 != uVar15);
                }
              }
              else if ((uVar15 & 1) == 0) {
                if (0 < nWords) {
                  uVar15 = 0;
                  do {
                    *(undefined4 *)(lVar5 + uVar15 * 4) = *(undefined4 *)(lVar8 + uVar15 * 4);
                    uVar15 = uVar15 + 1;
                  } while (uVar12 != uVar15);
                }
              }
              else if (0 < nWords) {
                uVar15 = 0;
                do {
                  *(uint *)(lVar5 + uVar15 * 4) = ~*(uint *)(lVar8 + uVar15 * 4);
                  uVar15 = uVar15 + 1;
                } while (uVar12 != uVar15);
              }
              if (lVar19 < (long)p->nTruePos - (long)p->nConstrs) {
                if (0 < nWords) {
                  uVar15 = 0;
                  do {
                    puVar1 = (uint *)(lVar21 + uVar15 * 4);
                    *puVar1 = *puVar1 | *(uint *)(lVar5 + uVar15 * 4);
                    uVar15 = uVar15 + 1;
                  } while (uVar12 != uVar15);
                }
              }
              else if (lVar19 < p->nTruePos && 0 < nWords) {
                uVar15 = 0;
                do {
                  puVar1 = (uint *)(lVar4 + uVar15 * 4);
                  *puVar1 = *puVar1 | *(uint *)(lVar5 + uVar15 * 4);
                  uVar15 = uVar15 + 1;
                } while (uVar12 != uVar15);
              }
              lVar19 = lVar19 + 1;
            } while (lVar19 < pVVar3->nSize);
          }
          uVar15 = (ulong)(uint)p->nTruePos;
          if (0 < p->nTruePos) {
            uVar20 = 0;
            do {
              if ((long)p->vCos->nSize <= (long)uVar20) goto LAB_006e254e;
              iVar24 = *(int *)((long)p->vCos->pArray[uVar20] + 0x24);
              if (((long)iVar24 < 0) || ((int)uVar23 <= iVar24)) goto LAB_006e254e;
              if (nWords < 1) {
                if ((long)uVar20 < (long)(int)uVar15 - (long)p->nConstrs) {
                  uVar15 = 0;
LAB_006e226c:
                  if ((int)uVar15 != nWords) {
                    printf("Primary output %d fails on some input patterns.\n",uVar20 & 0xffffffff);
                  }
                }
              }
              else {
                if (lVar16 <= (long)uVar20) {
LAB_006e256d:
                  __assert_fail("i >= 0 && i < p->nSize",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                                ,0x1dc,"int Vec_IntAddToEntry(Vec_Int_t *, int, int)");
                }
                lVar19 = __ptr[iVar24];
                iVar24 = *(int *)((long)pvVar10 + uVar20 * 4);
                uVar18 = 0;
                do {
                  uVar13 = *(uint *)(lVar19 + uVar18 * 4);
                  uVar13 = (uVar13 & 0x55555555) + (uVar13 >> 1 & 0x55555555);
                  uVar13 = (uVar13 & 0x33333333) + (uVar13 >> 2 & 0x33333333);
                  uVar13 = (uVar13 & 0x7070707) + (uVar13 >> 4 & 0x7070707);
                  uVar13 = (uVar13 & 0xf000f) + (uVar13 >> 8 & 0xf000f);
                  iVar24 = (uVar13 >> 0x10) + iVar24 + (uVar13 & 0xffff);
                  *(int *)((long)pvVar10 + uVar20 * 4) = iVar24;
                  uVar18 = uVar18 + 1;
                } while (uVar12 != uVar18);
                if ((long)uVar20 < (long)(int)uVar15 - (long)p->nConstrs) {
                  uVar15 = 0;
                  if (nWords < 1) goto LAB_006e226c;
                  do {
                    if ((*(uint *)(lVar19 + uVar15 * 4) & ~*(uint *)(lVar4 + uVar15 * 4)) != 0)
                    goto LAB_006e226c;
                    uVar15 = uVar15 + 1;
                  } while (uVar12 != uVar15);
                }
                else if (0 < nWords) {
                  if ((long)*local_68 <= (long)uVar20) goto LAB_006e256d;
                  lVar5 = *(long *)(local_80 + 2);
                  iVar24 = *(int *)(lVar5 + uVar20 * 4);
                  uVar15 = 0;
                  do {
                    uVar13 = *(uint *)(lVar21 + uVar15 * 4) & *(uint *)(lVar19 + uVar15 * 4);
                    uVar13 = (uVar13 & 0x55555555) + (uVar13 >> 1 & 0x55555555);
                    uVar13 = (uVar13 & 0x33333333) + (uVar13 >> 2 & 0x33333333);
                    uVar13 = (uVar13 & 0x7070707) + (uVar13 >> 4 & 0x7070707);
                    uVar13 = (uVar13 & 0xf000f) + (uVar13 >> 8 & 0xf000f);
                    iVar24 = (uVar13 >> 0x10) + iVar24 + (uVar13 & 0xffff);
                    *(int *)(lVar5 + uVar20 * 4) = iVar24;
                    uVar15 = uVar15 + 1;
                  } while (uVar12 != uVar15);
                }
              }
              uVar20 = uVar20 + 1;
              uVar15 = (ulong)p->nTruePos;
            } while ((long)uVar20 < (long)uVar15);
          }
          iVar9 = iVar9 + 1;
        } while (iVar9 != nFrames);
      }
      if (fVerbose != 0) {
        iVar24 = 3;
        iVar9 = clock_gettime(3,&local_50);
        if (iVar9 < 0) {
          lVar21 = -1;
        }
        else {
          lVar21 = local_50.tv_nsec / 1000 + local_50.tv_sec * 1000000;
        }
        Abc_Print(iVar24,"%s =","T");
        Abc_Print(iVar24,"%9.2f sec\n",(double)(lVar21 + local_70) / 1000000.0);
        uVar12 = (ulong)(uint)p->nTruePos;
        if (0 < p->nTruePos) {
          fVar25 = (float)(nWords * nFrames * 0x20);
          lVar21 = 0;
          do {
            if (p->vCos->nSize <= lVar21) goto LAB_006e254e;
            pvVar11 = p->vCos->pArray[lVar21];
            if (lVar21 < (int)uVar12 - p->nConstrs) {
              printf("Primary output :  ");
            }
            else {
              printf("Constraint %3d :  ",(ulong)(uint)((p->nConstrs - (int)uVar12) + (int)lVar21));
            }
            if ((lVar16 <= lVar21) ||
               (printf("ProbOne = %f  ",
                       (double)((float)*(int *)((long)pvVar10 + lVar21 * 4) / fVar25)),
               *local_68 <= lVar21)) {
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                            ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
            }
            printf("ProbOneC = %f  ",
                   (double)((float)*(int *)(*(long *)(local_80 + 2) + lVar21 * 4) / fVar25));
            printf("AllZeroValue = %d ",(ulong)(*(uint *)((long)pvVar11 + 0x18) >> 3 & 1));
            putchar(10);
            lVar21 = lVar21 + 1;
            uVar12 = (ulong)p->nTruePos;
          } while (lVar21 < (long)uVar12);
        }
      }
      if (__ptr != (undefined8 *)0x0) {
        free(__ptr);
      }
      if (pvVar10 != (void *)0x0) {
        free(pvVar10);
      }
      if (*(void **)(local_80 + 2) != (void *)0x0) {
        free(*(void **)(local_80 + 2));
      }
      free(local_80);
      return 1;
    }
  }
LAB_006e254e:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
}

Assistant:

int Ssw_ManProfileConstraints( Aig_Man_t * p, int nWords, int nFrames, int fVerbose )
{
    Vec_Ptr_t * vInfo;
    Vec_Int_t * vProbs, * vProbs2;
    Aig_Obj_t * pObj, * pObjLi;
    unsigned * pInfo, * pInfo0, * pInfo1, * pInfoMask, * pInfoMask2;
    int i, w, f, RetValue = 1;
    abctime clk = Abc_Clock();
    if ( fVerbose )
        printf( "Simulating %d nodes and %d flops for %d frames with %d words... ", 
            Aig_ManNodeNum(p), Aig_ManRegNum(p), nFrames, nWords );
    Aig_ManRandom( 1 );
    vInfo = Vec_PtrAllocSimInfo( Aig_ManObjNumMax(p)+2, nWords );
    Vec_PtrCleanSimInfo( vInfo, 0, nWords );
    vProbs  = Vec_IntStart( Saig_ManPoNum(p) );
    vProbs2 = Vec_IntStart( Saig_ManPoNum(p) );
    // start the constant
    pInfo = (unsigned *)Vec_PtrEntry( vInfo, Aig_ObjId(Aig_ManConst1(p)) );
    for ( w = 0; w < nWords; w++ )
        pInfo[w] = ~0;
    // start the flop inputs
    Saig_ManForEachLi( p, pObj, i )
    {
        pInfo = (unsigned *)Vec_PtrEntry( vInfo, Aig_ObjId(pObj) );
        for ( w = 0; w < nWords; w++ )
            pInfo[w] = 0;
    }
    // get the info mask
    pInfoMask  = (unsigned *)Vec_PtrEntry( vInfo, Aig_ManObjNumMax(p) );    // PO failed
    pInfoMask2 = (unsigned *)Vec_PtrEntry( vInfo, Aig_ManObjNumMax(p)+1 );  // constr failed
    for ( f = 0; f < nFrames; f++ )
    {
        // assign primary inputs
        Saig_ManForEachPi( p, pObj, i )
        {
            pInfo = (unsigned *)Vec_PtrEntry( vInfo, Aig_ObjId(pObj) );
            for ( w = 0; w < nWords; w++ )
                pInfo[w] = Aig_ManRandom( 0 );
        }
        // move the flop values
        Saig_ManForEachLiLo( p, pObjLi, pObj, i )
        {
            pInfo  = (unsigned *)Vec_PtrEntry( vInfo, Aig_ObjId(pObj) );
            pInfo0 = (unsigned *)Vec_PtrEntry( vInfo, Aig_ObjId(pObjLi) );
            for ( w = 0; w < nWords; w++ )
                pInfo[w] = pInfo0[w];
        }
        // simulate the nodes
        Aig_ManForEachNode( p, pObj, i )
        {
            pInfo  = (unsigned *)Vec_PtrEntry( vInfo, Aig_ObjId(pObj) );
            pInfo0 = (unsigned *)Vec_PtrEntry( vInfo, Aig_ObjFaninId0(pObj) );
            pInfo1 = (unsigned *)Vec_PtrEntry( vInfo, Aig_ObjFaninId1(pObj) );
            if ( Aig_ObjFaninC0(pObj) )
            {
                if (  Aig_ObjFaninC1(pObj) )
                    for ( w = 0; w < nWords; w++ )
                        pInfo[w] = ~(pInfo0[w] | pInfo1[w]);
                else 
                    for ( w = 0; w < nWords; w++ )
                        pInfo[w] = ~pInfo0[w] & pInfo1[w];
            }
            else 
            {
                if (  Aig_ObjFaninC1(pObj) )
                    for ( w = 0; w < nWords; w++ )
                        pInfo[w] = pInfo0[w] & ~pInfo1[w];
                else 
                    for ( w = 0; w < nWords; w++ )
                        pInfo[w] = pInfo0[w] & pInfo1[w];
            }
        }
        // clean the mask
        for ( w = 0; w < nWords; w++ )
            pInfoMask[w] = pInfoMask2[w] = 0;
        // simulate the primary outputs
        Aig_ManForEachCo( p, pObj, i )
        {
            pInfo  = (unsigned *)Vec_PtrEntry( vInfo, Aig_ObjId(pObj) );
            pInfo0 = (unsigned *)Vec_PtrEntry( vInfo, Aig_ObjFaninId0(pObj) );
            if ( i < Saig_ManPoNum(p)-Saig_ManConstrNum(p) || i >= Saig_ManPoNum(p) )
            {
                if ( Aig_ObjFaninC0(pObj) )
                {
                    for ( w = 0; w < nWords; w++ )
                        pInfo[w] = ~pInfo0[w];
                }
                else 
                {
                    for ( w = 0; w < nWords; w++ )
                        pInfo[w] = pInfo0[w];
                }
            }
            else
            {
                if ( Aig_ObjFaninC0(pObj) )
                {
                    for ( w = 0; w < nWords; w++ )
                        pInfo[w] |= ~pInfo0[w];
                }
                else 
                {
                    for ( w = 0; w < nWords; w++ )
                        pInfo[w] |= pInfo0[w];
                }
            }
            // collect patterns when one of the outputs fails
            if ( i < Saig_ManPoNum(p)-Saig_ManConstrNum(p) )
            {
                for ( w = 0; w < nWords; w++ )
                    pInfoMask[w] |= pInfo[w];
            }
            else if ( i < Saig_ManPoNum(p) )
            {
                for ( w = 0; w < nWords; w++ )
                    pInfoMask2[w] |= pInfo[w];
            }
        }
        // compare the PO values (mask=1 => out=0) or UNSAT(mask=1 & out=1)
        Saig_ManForEachPo( p, pObj, i )
        {
            pInfo  = (unsigned *)Vec_PtrEntry( vInfo, Aig_ObjId(pObj) );
            for ( w = 0; w < nWords; w++ )
                Vec_IntAddToEntry( vProbs, i, Aig_WordCountOnes(pInfo[w]) );
            if ( i < Saig_ManPoNum(p)-Saig_ManConstrNum(p) )
            {
                // chek the output
                for ( w = 0; w < nWords; w++ )
                    if ( pInfo[w] & ~pInfoMask2[w] ) 
                        break;
                if ( w == nWords )
                    continue;
                printf( "Primary output %d fails on some input patterns.\n", i );
            }
            else
            {
                // collect patterns that block the POs
                for ( w = 0; w < nWords; w++ )
                    Vec_IntAddToEntry( vProbs2, i, Aig_WordCountOnes(pInfo[w] & pInfoMask[w]) );
            }
        }
    }
    if ( fVerbose )
        Abc_PrintTime( 1, "T", Abc_Clock() - clk );
    // print the state
    if ( fVerbose )
    {
        Saig_ManForEachPo( p, pObj, i )
        {
            if ( i < Saig_ManPoNum(p) - Saig_ManConstrNum(p) )
                printf( "Primary output :  " );
            else
                printf( "Constraint %3d :  ", i-(Saig_ManPoNum(p) - Saig_ManConstrNum(p))  );
            printf( "ProbOne = %f  ",  (float)Vec_IntEntry(vProbs,  i)/(32*nWords*nFrames) );
            printf( "ProbOneC = %f  ", (float)Vec_IntEntry(vProbs2, i)/(32*nWords*nFrames) );
            printf( "AllZeroValue = %d ", Aig_ObjPhase(pObj) );
            printf( "\n" );
        }
    }

    // print the states
    Vec_PtrFree( vInfo );
    Vec_IntFree( vProbs );
    Vec_IntFree( vProbs2 );
    return RetValue;
}